

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

string * dynamicgraph::toString<double>
                   (string *__return_storage_ptr__,vector<double,_std::allocator<double>_> *v,
                   int precision,int width,string *separator)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  _Setw _Var2;
  _Setprecision _Var3;
  size_type sVar4;
  ostream *poVar5;
  const_reference pvVar6;
  uint local_1d8;
  uint i_1;
  uint local_1b4;
  stringstream local_1b0 [4];
  uint i;
  stringstream ss;
  undefined1 local_1a0 [376];
  string *local_28;
  string *separator_local;
  int width_local;
  int precision_local;
  vector<double,_std::allocator<double>_> *v_local;
  
  local_28 = separator;
  separator_local._0_4_ = width;
  separator_local._4_4_ = precision;
  _width_local = v;
  v_local = (vector<double,_std::allocator<double>_> *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b0);
  if (separator_local._4_4_ < (int)separator_local) {
    local_1b4 = 0;
    while( true ) {
      sVar4 = std::vector<double,_std::allocator<double>_>::size(_width_local);
      if (sVar4 - 1 <= (ulong)local_1b4) break;
      poVar5 = (ostream *)std::ostream::operator<<(local_1a0,std::fixed);
      _Var2 = std::setw((int)separator_local);
      poVar5 = std::operator<<(poVar5,_Var2);
      _Var3 = std::setprecision(separator_local._4_4_);
      poVar5 = std::operator<<(poVar5,_Var3);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (_width_local,(ulong)local_1b4);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar6);
      std::operator<<(poVar5,(string *)separator);
      local_1b4 = local_1b4 + 1;
    }
    poVar5 = (ostream *)std::ostream::operator<<(local_1a0,std::fixed);
    _Var2 = std::setw((int)separator_local);
    poVar5 = std::operator<<(poVar5,_Var2);
    _Var3 = std::setprecision(separator_local._4_4_);
    poVar5 = std::operator<<(poVar5,_Var3);
    pvVar1 = _width_local;
    sVar4 = std::vector<double,_std::allocator<double>_>::size(_width_local);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,sVar4 - 1);
    std::ostream::operator<<(poVar5,*pvVar6);
  }
  else {
    local_1d8 = 0;
    while( true ) {
      sVar4 = std::vector<double,_std::allocator<double>_>::size(_width_local);
      if (sVar4 - 1 <= (ulong)local_1d8) break;
      poVar5 = (ostream *)std::ostream::operator<<(local_1a0,std::fixed);
      _Var3 = std::setprecision(separator_local._4_4_);
      poVar5 = std::operator<<(poVar5,_Var3);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (_width_local,(ulong)local_1d8);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar6);
      std::operator<<(poVar5,(string *)separator);
      local_1d8 = local_1d8 + 1;
    }
    poVar5 = (ostream *)std::ostream::operator<<(local_1a0,std::fixed);
    _Var3 = std::setprecision(separator_local._4_4_);
    poVar5 = std::operator<<(poVar5,_Var3);
    pvVar1 = _width_local;
    sVar4 = std::vector<double,_std::allocator<double>_>::size(_width_local);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,sVar4 - 1);
    std::ostream::operator<<(poVar5,*pvVar6);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(const std::vector<T> &v, const int precision = 3,
                     const int width = -1, const std::string separator = ", ") {
  std::stringstream ss;
  if (width > precision) {
    for (unsigned int i = 0; i < v.size() - 1; i++)
      ss << std::fixed << std::setw(width) << std::setprecision(precision)
         << v[i] << separator;
    ss << std::fixed << std::setw(width) << std::setprecision(precision)
       << v[v.size() - 1];
  } else {
    for (unsigned int i = 0; i < v.size() - 1; i++)
      ss << std::fixed << std::setprecision(precision) << v[i] << separator;
    ss << std::fixed << std::setprecision(precision) << v[v.size() - 1];
  }

  return ss.str();
}